

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O1

string * __thiscall
NoViableAltException::toString_abi_cxx11_(string *__return_storage_ptr__,NoViableAltException *this)

{
  size_type *psVar1;
  Ref *pRVar2;
  uint __val;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 *puVar6;
  long *plVar7;
  uint uVar8;
  ulong *puVar9;
  ulong uVar10;
  uint __len;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  pRVar2 = (this->token).ref;
  if ((pRVar2 == (Ref *)0x0) || (pRVar2->ptr == (Token *)0x0)) {
    (**(code **)(*(long *)&(this->super_ParserException).super_ANTLRException + 0x28))
              (__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"line(","");
  uVar5 = (**(code **)(*(long *)&(this->super_ParserException).super_ANTLRException + 0x30))(this);
  __val = -uVar5;
  if (0 < (int)uVar5) {
    __val = uVar5;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_001e8aeb;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_001e8aeb;
      }
      if (uVar8 < 10000) goto LAB_001e8aeb;
      uVar10 = uVar10 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_001e8aeb:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)__len - (char)((int)uVar5 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar5 >> 0x1f) + (long)local_b0),__len,__val);
  uVar10 = 0xf;
  if (local_90 != local_80) {
    uVar10 = local_80[0];
  }
  if (uVar10 < (ulong)(local_a8 + local_88)) {
    uVar10 = 0xf;
    if (local_b0 != local_a0) {
      uVar10 = local_a0[0];
    }
    if (uVar10 < (ulong)(local_a8 + local_88)) goto LAB_001e8b5f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_001e8b5f:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
  }
  local_d0 = &local_c0;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_c0 = *plVar7;
    uStack_b8 = puVar6[3];
  }
  else {
    local_c0 = *plVar7;
    local_d0 = (long *)*puVar6;
  }
  local_c8 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_60 = *puVar9;
    uStack_58 = (undefined4)plVar7[3];
    uStack_54 = *(undefined4 *)((long)plVar7 + 0x1c);
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar9;
    local_70 = (ulong *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (**(code **)(*(long *)&(this->super_ParserException).super_ANTLRException + 0x28))(&local_50,this)
  ;
  uVar10 = 0xf;
  if (local_70 != &local_60) {
    uVar10 = local_60;
  }
  if (uVar10 < (ulong)(local_48 + local_68)) {
    uVar10 = 0xf;
    if (local_50 != local_40) {
      uVar10 = local_40[0];
    }
    if ((ulong)(local_48 + local_68) <= uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_001e8c9c;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
LAB_001e8c9c:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar3 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NoViableAltException::toString() const
{
	if (token)
		return std::string("line(")+std::to_string(getLine())+"), "+getErrorMessage();
	else
		return getErrorMessage();
}